

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_BinaryFile(char *s,int32_t startPos)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  int local_34;
  int byte;
  int32_t fsize;
  FILE *f;
  size_t size;
  char *fullPath;
  char *pcStack_10;
  int32_t startPos_local;
  char *s_local;
  
  fullPath._4_4_ = startPos;
  pcStack_10 = s;
  if (startPos < 0) {
    error("Start position cannot be negative (%d)\n",(ulong)(uint)startPos);
    fullPath._4_4_ = 0;
  }
  bVar2 = checkcodesection();
  if (!bVar2) {
    return;
  }
  size = 0;
  f = (FILE *)0x0;
  _byte = (FILE *)0x0;
  bVar2 = fstk_FindFile(pcStack_10,(char **)&size,(size_t *)&f);
  if (bVar2) {
    _byte = fopen((char *)size,"rb");
  }
  free((void *)size);
  pcVar1 = pcStack_10;
  if (_byte == (FILE *)0x0) {
    if ((generatedMissingIncludes & 1U) != 0) {
      if ((verbose & 1U) != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        printf("Aborting (-MG) on INCBIN file \'%s\' (%s)\n",pcVar1,pcVar5);
      }
      failedOnMissingInclude = true;
      return;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    error("Error opening INCBIN file \'%s\': %s\n",pcVar1,pcVar5);
    return;
  }
  local_34 = -1;
  iVar3 = fseek(_byte,0,2);
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    pcVar1 = pcStack_10;
    if (*piVar4 != 0x1d) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      error("Error determining size of INCBIN file \'%s\': %s\n",pcVar1,pcVar5);
    }
    while (iVar3 = fullPath._4_4_ + -1, bVar2 = fullPath._4_4_ != 0, fullPath._4_4_ = iVar3, bVar2)
    {
      fgetc(_byte);
    }
  }
  else {
    lVar6 = ftell(_byte);
    local_34 = (int)lVar6;
    if (local_34 < fullPath._4_4_) {
      error("Specified start position is greater than length of file\n");
      goto LAB_00119d71;
    }
    fseek(_byte,(long)fullPath._4_4_,0);
    bVar2 = reserveSpace(local_34 - fullPath._4_4_);
    if (!bVar2) goto LAB_00119d71;
  }
  while (iVar3 = fgetc(_byte), iVar3 != -1) {
    if (local_34 == -1) {
      growSection(1);
    }
    writebyte((uint8_t)iVar3);
  }
  iVar3 = ferror(_byte);
  pcVar1 = pcStack_10;
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    error("Error reading INCBIN file \'%s\': %s\n",pcVar1,pcVar5);
  }
LAB_00119d71:
  fclose(_byte);
  return;
}

Assistant:

void sect_BinaryFile(char const *s, int32_t startPos)
{
	if (startPos < 0) {
		error("Start position cannot be negative (%" PRId32 ")\n", startPos);
		startPos = 0;
	}
	if (!checkcodesection())
		return;

	char *fullPath = NULL;
	size_t size = 0;
	FILE *f = NULL;

	if (fstk_FindFile(s, &fullPath, &size))
		f = fopen(fullPath, "rb");
	free(fullPath);

	if (!f) {
		if (generatedMissingIncludes) {
			if (verbose)
				printf("Aborting (-MG) on INCBIN file '%s' (%s)\n", s, strerror(errno));
			failedOnMissingInclude = true;
			return;
		}
		error("Error opening INCBIN file '%s': %s\n", s, strerror(errno));
		return;
	}

	int32_t fsize = -1;
	int byte;

	if (fseek(f, 0, SEEK_END) != -1) {
		fsize = ftell(f);

		if (startPos > fsize) {
			error("Specified start position is greater than length of file\n");
			goto cleanup;
		}

		fseek(f, startPos, SEEK_SET);
		if (!reserveSpace(fsize - startPos))
			goto cleanup;
	} else {
		if (errno != ESPIPE)
			error("Error determining size of INCBIN file '%s': %s\n",
			      s, strerror(errno));
		// The file isn't seekable, so we'll just skip bytes
		while (startPos--)
			(void)fgetc(f);
	}

	while ((byte = fgetc(f)) != EOF) {
		if (fsize == -1)
			growSection(1);
		writebyte(byte);
	}

	if (ferror(f))
		error("Error reading INCBIN file '%s': %s\n", s, strerror(errno));

cleanup:
	fclose(f);
}